

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersector1<4,_16777232,_true,_embree::avx2::ArrayIntersector1<embree::avx2::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  Geometry *this;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 (*pauVar11) [16];
  bool bVar12;
  bool bVar13;
  undefined4 uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  byte bVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  long lVar22;
  size_t i;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1058 [8];
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  long local_1030;
  long local_1028;
  ulong local_1020;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  undefined1 local_fe8 [16];
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    return false;
  }
  uStack_f70 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    local_1048 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    local_1048 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
  }
  pauVar20 = (undefined1 (*) [16])local_f68;
  uVar14 = *(undefined4 *)&(query->p).field_0;
  local_f98._4_4_ = uVar14;
  local_f98._0_4_ = uVar14;
  local_f98._8_4_ = uVar14;
  local_f98._12_4_ = uVar14;
  auVar32 = ZEXT1664(local_f98);
  uVar14 = *(undefined4 *)((long)&(query->p).field_0 + 4);
  local_fa8._4_4_ = uVar14;
  local_fa8._0_4_ = uVar14;
  local_fa8._8_4_ = uVar14;
  local_fa8._12_4_ = uVar14;
  auVar33 = ZEXT1664(local_fa8);
  uVar14 = *(undefined4 *)((long)&(query->p).field_0 + 8);
  local_fb8._4_4_ = uVar14;
  local_fb8._0_4_ = uVar14;
  local_fb8._8_4_ = uVar14;
  local_fb8._12_4_ = uVar14;
  auVar34 = ZEXT1664(local_fb8);
  uVar14 = *(undefined4 *)&(context->query_radius).field_0;
  auVar25._4_4_ = uVar14;
  auVar25._0_4_ = uVar14;
  auVar25._8_4_ = uVar14;
  auVar25._12_4_ = uVar14;
  uVar14 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar27._4_4_ = uVar14;
  auVar27._0_4_ = uVar14;
  auVar27._8_4_ = uVar14;
  auVar27._12_4_ = uVar14;
  uVar14 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar29._4_4_ = uVar14;
  auVar29._0_4_ = uVar14;
  auVar29._8_4_ = uVar14;
  auVar29._12_4_ = uVar14;
  bVar13 = false;
  do {
    local_fc8 = vsubps_avx(auVar32._0_16_,auVar25);
    fVar4 = auVar25._0_4_;
    fVar5 = auVar25._4_4_;
    fVar6 = auVar25._8_4_;
    fVar7 = auVar25._12_4_;
    local_fd8 = auVar32._0_4_ + fVar4;
    fStack_fd4 = auVar32._4_4_ + fVar5;
    fStack_fd0 = auVar32._8_4_ + fVar6;
    fStack_fcc = auVar32._12_4_ + fVar7;
    local_fe8 = vsubps_avx(auVar33._0_16_,auVar27);
    local_ff8 = auVar33._0_4_ + auVar27._0_4_;
    fStack_ff4 = auVar33._4_4_ + auVar27._4_4_;
    fStack_ff0 = auVar33._8_4_ + auVar27._8_4_;
    fStack_fec = auVar33._12_4_ + auVar27._12_4_;
    local_1008 = vsubps_avx(auVar34._0_16_,auVar29);
    local_1018._0_4_ = auVar34._0_4_ + auVar29._0_4_;
    local_1018._4_4_ = auVar34._4_4_ + auVar29._4_4_;
    local_1018._8_4_ = auVar34._8_4_ + auVar29._8_4_;
    local_1018._12_4_ = auVar34._12_4_ + auVar29._12_4_;
    local_f88._0_4_ = fVar4 * fVar4;
    local_f88._4_4_ = fVar5 * fVar5;
    local_f88._8_4_ = fVar6 * fVar6;
    local_f88._12_4_ = fVar7 * fVar7;
    auVar35 = ZEXT1664(local_f88);
LAB_014972b0:
    do {
      do {
        if (pauVar20 == (undefined1 (*) [16])&local_f78) {
          return bVar13;
        }
        pauVar11 = pauVar20 + -1;
        pauVar20 = pauVar20 + -1;
      } while ((float)local_1048._0_4_ < *(float *)(*pauVar11 + 8));
      uVar16 = *(ulong *)*pauVar20;
LAB_014972d0:
      uVar17 = (uint)uVar16;
      auVar25 = auVar32._0_16_;
      auVar27 = auVar33._0_16_;
      auVar29 = auVar34._0_16_;
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if ((uVar16 & 8) != 0) goto LAB_014976dd;
        uVar15 = uVar16 & 0xfffffffffffffff0;
        fVar4 = query->time;
        auVar24._4_4_ = fVar4;
        auVar24._0_4_ = fVar4;
        auVar24._8_4_ = fVar4;
        auVar24._12_4_ = fVar4;
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x20));
        auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xa0),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x40));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xc0),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x60));
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x90),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x30));
        auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xb0),auVar24,
                                 *(undefined1 (*) [16])(uVar15 + 0x50));
        auVar10 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xd0),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x70));
        auVar8 = vmaxps_avx(auVar25,auVar26);
        auVar8 = vminps_avx(auVar8,auVar31);
        auVar8 = vsubps_avx(auVar8,auVar25);
        auVar25 = vmaxps_avx(auVar27,auVar28);
        auVar25 = vminps_avx(auVar25,auVar9);
        auVar27 = vsubps_avx(auVar25,auVar27);
        auVar25 = vmaxps_avx(auVar29,auVar30);
        auVar25 = vminps_avx(auVar25,auVar10);
        auVar25 = vsubps_avx(auVar25,auVar29);
        local_1058._4_4_ =
             auVar25._4_4_ * auVar25._4_4_ +
             auVar27._4_4_ * auVar27._4_4_ + auVar8._4_4_ * auVar8._4_4_;
        local_1058._0_4_ =
             auVar25._0_4_ * auVar25._0_4_ +
             auVar27._0_4_ * auVar27._0_4_ + auVar8._0_4_ * auVar8._0_4_;
        fStack_1050 = auVar25._8_4_ * auVar25._8_4_ +
                      auVar27._8_4_ * auVar27._8_4_ + auVar8._8_4_ * auVar8._8_4_;
        fStack_104c = auVar25._12_4_ * auVar25._12_4_ +
                      auVar27._12_4_ * auVar27._12_4_ + auVar8._12_4_ * auVar8._12_4_;
        auVar25 = vcmpps_avx(auVar26,auVar31,2);
        auVar27 = vcmpps_avx(auVar9,local_fe8,5);
        auVar25 = vandps_avx(auVar25,auVar27);
        auVar9._4_4_ = fStack_fd4;
        auVar9._0_4_ = local_fd8;
        auVar9._8_4_ = fStack_fd0;
        auVar9._12_4_ = fStack_fcc;
        auVar27 = vcmpps_avx(auVar26,auVar9,2);
        auVar8._4_4_ = fStack_ff4;
        auVar8._0_4_ = local_ff8;
        auVar8._8_4_ = fStack_ff0;
        auVar8._12_4_ = fStack_fec;
        auVar29 = vcmpps_avx(auVar28,auVar8,2);
        auVar27 = vandps_avx(auVar29,auVar27);
        auVar29 = vcmpps_avx(auVar10,local_1008,5);
        auVar25 = vandps_avx(auVar25,auVar29);
        auVar29 = vcmpps_avx(auVar31,local_fc8,5);
        auVar8 = vcmpps_avx(auVar30,local_1018,2);
        auVar29 = vandps_avx(auVar8,auVar29);
        auVar27 = vandps_avx(auVar27,auVar29);
        auVar25 = vandps_avx(auVar27,auVar25);
        if ((uVar17 & 7) == 6) {
LAB_014974fd:
          auVar27 = vcmpps_avx(*(undefined1 (*) [16])((uVar16 & 0xfffffffffffffff0) + 0xe0),auVar24,
                               2);
          auVar29 = vcmpps_avx(auVar24,*(undefined1 (*) [16])((uVar16 & 0xfffffffffffffff0) + 0xf0),
                               1);
          auVar27 = vandps_avx(auVar27,auVar29);
          auVar25 = vandps_avx(auVar27,auVar25);
          auVar25 = vpslld_avx(auVar25,0x1f);
        }
        else {
          auVar25 = vpslld_avx(auVar25,0x1f);
        }
        uVar14 = vmovmskps_avx(auVar25);
        uVar15 = CONCAT44((int)(uVar16 >> 0x20),uVar14);
LAB_014973a8:
        if (uVar15 != 0) {
          uVar21 = uVar16 & 0xfffffffffffffff0;
          lVar22 = 0;
          for (uVar16 = uVar15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
            lVar22 = lVar22 + 1;
          }
          uVar17 = (uint)uVar15 - 1 & (uint)uVar15;
          uVar15 = (ulong)uVar17;
          uVar16 = *(ulong *)(uVar21 + lVar22 * 8);
          if (uVar17 != 0) {
            uVar2 = *(uint *)(local_1058 + lVar22 * 4);
            lVar22 = 0;
            for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar22 = lVar22 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar19 = (ulong)uVar17;
            uVar15 = *(ulong *)(uVar21 + lVar22 * 8);
            uVar3 = *(uint *)(local_1058 + lVar22 * 4);
            if (uVar17 == 0) {
              if (uVar2 < uVar3) {
                *(ulong *)*pauVar20 = uVar15;
                *(uint *)(*pauVar20 + 8) = uVar3;
                pauVar20 = pauVar20 + 1;
              }
              else {
                *(ulong *)*pauVar20 = uVar16;
                *(uint *)(*pauVar20 + 8) = uVar2;
                pauVar20 = pauVar20 + 1;
                uVar16 = uVar15;
              }
            }
            else {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = uVar16;
              auVar25 = vpunpcklqdq_avx(auVar26,ZEXT416(uVar2));
              auVar28._8_8_ = 0;
              auVar28._0_8_ = uVar15;
              auVar27 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar3));
              lVar22 = 0;
              for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              uVar17 = uVar17 - 1 & uVar17;
              uVar16 = (ulong)uVar17;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(uVar21 + lVar22 * 8);
              auVar8 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_1058 + lVar22 * 4)));
              auVar29 = vpcmpgtd_avx(auVar27,auVar25);
              if (uVar17 == 0) {
                auVar26 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar27,auVar25,auVar26);
                auVar25 = vblendvps_avx(auVar25,auVar27,auVar26);
                auVar27 = vpcmpgtd_avx(auVar8,auVar29);
                auVar26 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar8,auVar29,auVar26);
                auVar29 = vblendvps_avx(auVar29,auVar8,auVar26);
                auVar8 = vpcmpgtd_avx(auVar29,auVar25);
                auVar26 = vpshufd_avx(auVar8,0xaa);
                auVar8 = vblendvps_avx(auVar29,auVar25,auVar26);
                auVar25 = vblendvps_avx(auVar25,auVar29,auVar26);
                *pauVar20 = auVar25;
                pauVar20[1] = auVar8;
                uVar16 = auVar27._0_8_;
                pauVar20 = pauVar20 + 2;
              }
              else {
                lVar22 = 0;
                for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                  lVar22 = lVar22 + 1;
                }
                auVar31._8_8_ = 0;
                auVar31._0_8_ = *(ulong *)(uVar21 + lVar22 * 8);
                auVar28 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_1058 + lVar22 * 4)));
                auVar26 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar27,auVar25,auVar26);
                auVar25 = vblendvps_avx(auVar25,auVar27,auVar26);
                auVar27 = vpcmpgtd_avx(auVar28,auVar8);
                auVar26 = vpshufd_avx(auVar27,0xaa);
                auVar27 = vblendvps_avx(auVar28,auVar8,auVar26);
                auVar8 = vblendvps_avx(auVar8,auVar28,auVar26);
                auVar26 = vpcmpgtd_avx(auVar8,auVar25);
                auVar28 = vpshufd_avx(auVar26,0xaa);
                auVar26 = vblendvps_avx(auVar8,auVar25,auVar28);
                auVar25 = vblendvps_avx(auVar25,auVar8,auVar28);
                auVar8 = vpcmpgtd_avx(auVar27,auVar29);
                auVar28 = vpshufd_avx(auVar8,0xaa);
                auVar8 = vblendvps_avx(auVar27,auVar29,auVar28);
                auVar27 = vblendvps_avx(auVar29,auVar27,auVar28);
                auVar29 = vpcmpgtd_avx(auVar26,auVar27);
                auVar28 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar26,auVar27,auVar28);
                auVar27 = vblendvps_avx(auVar27,auVar26,auVar28);
                *pauVar20 = auVar25;
                pauVar20[1] = auVar27;
                pauVar20[2] = auVar29;
                uVar16 = auVar8._0_8_;
                pauVar20 = pauVar20 + 3;
              }
            }
          }
          goto LAB_014972d0;
        }
        goto LAB_014972b0;
      }
      if ((uVar16 & 8) == 0) {
        uVar15 = uVar16 & 0xfffffffffffffff0;
        fVar4 = query->time;
        auVar24._4_4_ = fVar4;
        auVar24._0_4_ = fVar4;
        auVar24._8_4_ = fVar4;
        auVar24._12_4_ = fVar4;
        auVar26 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x80),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x20));
        auVar28 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xa0),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x40));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xc0),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x60));
        auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0x90),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x30));
        auVar9 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xb0),auVar24,
                                 *(undefined1 (*) [16])(uVar15 + 0x50));
        auVar10 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar15 + 0xd0),auVar24,
                                  *(undefined1 (*) [16])(uVar15 + 0x70));
        auVar8 = vmaxps_avx(auVar25,auVar26);
        auVar8 = vminps_avx(auVar8,auVar31);
        auVar8 = vsubps_avx(auVar8,auVar25);
        auVar25 = vmaxps_avx(auVar27,auVar28);
        auVar25 = vminps_avx(auVar25,auVar9);
        auVar27 = vsubps_avx(auVar25,auVar27);
        auVar25 = vmaxps_avx(auVar29,auVar30);
        auVar25 = vminps_avx(auVar25,auVar10);
        auVar25 = vsubps_avx(auVar25,auVar29);
        local_1058._0_4_ =
             auVar8._0_4_ * auVar8._0_4_ + auVar27._0_4_ * auVar27._0_4_ +
             auVar25._0_4_ * auVar25._0_4_;
        local_1058._4_4_ =
             auVar8._4_4_ * auVar8._4_4_ + auVar27._4_4_ * auVar27._4_4_ +
             auVar25._4_4_ * auVar25._4_4_;
        fStack_1050 = auVar8._8_4_ * auVar8._8_4_ + auVar27._8_4_ * auVar27._8_4_ +
                      auVar25._8_4_ * auVar25._8_4_;
        fStack_104c = auVar8._12_4_ * auVar8._12_4_ + auVar27._12_4_ * auVar27._12_4_ +
                      auVar25._12_4_ * auVar25._12_4_;
        auVar25 = vcmpps_avx(_local_1058,auVar35._0_16_,2);
        auVar27 = vcmpps_avx(auVar26,auVar31,2);
        auVar25 = vandps_avx(auVar25,auVar27);
        if ((uVar17 & 7) == 6) goto LAB_014974fd;
        uVar14 = vmovmskps_avx(auVar25);
        uVar15 = CONCAT44((int)(uVar15 >> 0x20),uVar14);
        goto LAB_014973a8;
      }
LAB_014976dd:
      local_1030 = (ulong)(uVar17 & 0xf) - 8;
      lVar22 = (uVar16 & 0xfffffffffffffff0) + 0x50;
      local_1020 = 0;
      for (local_1028 = 0; local_1028 != local_1030; local_1028 = local_1028 + 1) {
        bVar18 = 0;
        for (lVar23 = 0; (lVar23 != 4 && (*(int *)(lVar22 + lVar23 * 4) != -1)); lVar23 = lVar23 + 1
            ) {
          uVar17 = *(uint *)(lVar22 + -0x10 + lVar23 * 4);
          this = (context->scene->geometries).items[uVar17].ptr;
          context->geomID = uVar17;
          context->primID = *(uint *)(lVar22 + lVar23 * 4);
          bVar12 = Geometry::pointQuery(this,query,context);
          auVar35 = ZEXT1664(local_f88);
          auVar34 = ZEXT1664(local_fb8);
          auVar33 = ZEXT1664(local_fa8);
          auVar32 = ZEXT1664(local_f98);
          bVar18 = bVar18 | bVar12;
        }
        local_1020 = CONCAT71((int7)(local_1020 >> 8),(byte)local_1020 | bVar18);
        lVar22 = lVar22 + 0x60;
      }
    } while ((local_1020 & 1) == 0);
    uVar14 = *(undefined4 *)&(context->query_radius).field_0;
    auVar25._4_4_ = uVar14;
    auVar25._0_4_ = uVar14;
    auVar25._8_4_ = uVar14;
    auVar25._12_4_ = uVar14;
    uVar14 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar27._4_4_ = uVar14;
    auVar27._0_4_ = uVar14;
    auVar27._8_4_ = uVar14;
    auVar27._12_4_ = uVar14;
    uVar14 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar29._4_4_ = uVar14;
    auVar29._0_4_ = uVar14;
    auVar29._8_4_ = uVar14;
    auVar29._12_4_ = uVar14;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_1048 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      local_1048 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    }
    bVar13 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }